

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_Disasm.c
# Opt level: O0

void GvEb(PDISASM pMyDisasm)

{
  PDISASM pMyDisasm_local;
  
  if ((pMyDisasm->Reserved_).OperandSize == 0x40) {
    (pMyDisasm->Reserved_).MemDecoration = 0x65;
    (pMyDisasm->Reserved_).OperandSize = 8;
    decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
    (pMyDisasm->Reserved_).OperandSize = 0x40;
  }
  else if ((pMyDisasm->Reserved_).OperandSize == 0x20) {
    (pMyDisasm->Reserved_).MemDecoration = 0x65;
    (pMyDisasm->Reserved_).OperandSize = 8;
    decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
    (pMyDisasm->Reserved_).OperandSize = 0x20;
  }
  else {
    (pMyDisasm->Reserved_).MemDecoration = 0x65;
    (pMyDisasm->Reserved_).OperandSize = 8;
    decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
    (pMyDisasm->Reserved_).OperandSize = 0x10;
  }
  decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
  (pMyDisasm->Reserved_).EIP_ =
       (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
  return;
}

Assistant:

void __bea_callspec__ GvEb(PDISASM pMyDisasm)
{
  if (GV.OperandSize == 64) {
    GV.MemDecoration = Arg2byte;
    GV.OperandSize = 8;
    decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
    GV.OperandSize = 64;
  }
  else if (GV.OperandSize == 32) {
    GV.MemDecoration = Arg2byte;
    GV.OperandSize = 8;
    decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
    GV.OperandSize = 32;
  }
  else {
    GV.MemDecoration = Arg2byte;
    GV.OperandSize = 8;
    decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
    GV.OperandSize = 16;
  }
  decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
  GV.EIP_ += GV.DECALAGE_EIP+2;
}